

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

NodeBase * __thiscall
SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
::EditingIterator::UnlinkCurrentNode(EditingIterator *this)

{
  RealCount *pRVar1;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  *pSVar6;
  NodeBase *pNVar7;
  
  pSVar2 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)(this->super_Iterator).current;
  pSVar6 = pSVar2;
  if (pSVar2 == (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar4) goto LAB_003de83e;
    *puVar5 = 0;
    pSVar6 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)(this->super_Iterator).current;
  }
  if (pSVar6 == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar4) goto LAB_003de83e;
    *puVar5 = 0;
  }
  pNVar7 = this->last;
  if (pNVar7 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar4) {
LAB_003de83e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pNVar7 = this->last;
  }
  pNVar7->next = ((this->super_Iterator).current)->next;
  pSVar6 = (this->super_Iterator).list;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  pRVar1 = &pSVar6->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return &pSVar2->super_SListNodeBase<Memory::ArenaAllocator>;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }